

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall ast::Instruction::check_alignment(Instruction *this)

{
  string local_30;
  Instruction *local_10;
  Instruction *this_local;
  
  if (((this->super_Statement).section_offset & 1) != 0) {
    local_10 = this;
    string_printf_abi_cxx11_
              (&local_30,
               "Misaligned address - instruction binary code must be located in an even address");
    warning_report(&(this->super_Statement).location,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void check_alignment() {
		if ((section_offset & 1) != 0)
			warning_report(&location,
				string_printf("Misaligned address - "
					"instruction binary code must be located in an even address"));
	}